

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int ffpscl(fitsfile *fptr,double scale,double zero,int *status)

{
  long lVar1;
  int iVar2;
  int local_3c [2];
  int hdutype;
  tcolumn *colptr;
  int *status_local;
  double zero_local;
  double scale_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if ((scale != 0.0) || (NAN(scale))) {
      colptr = (tcolumn *)status;
      status_local = (int *)zero;
      zero_local = scale;
      scale_local = (double)fptr;
      iVar2 = ffghdt(fptr,local_3c,status);
      if (iVar2 < 1) {
        if (local_3c[0] == 0) {
          iVar2 = fits_is_compressed_image((fitsfile *)scale_local,(int *)colptr);
          if (iVar2 == 0) {
            lVar1 = *(long *)(*(long *)((long)scale_local + 8) + 0x3d0);
            *(double *)(lVar1 + 0x100) = zero_local;
            *(int **)(lVar1 + 0x108) = status_local;
            fptr_local._4_4_ = *(int *)colptr->ttype;
          }
          else {
            *(double *)(*(long *)((long)scale_local + 8) + 0x500) = zero_local;
            *(int **)(*(long *)((long)scale_local + 8) + 0x508) = status_local;
            fptr_local._4_4_ = *(int *)colptr->ttype;
          }
        }
        else {
          colptr->ttype[0] = -0x17;
          colptr->ttype[1] = '\0';
          colptr->ttype[2] = '\0';
          colptr->ttype[3] = '\0';
          fptr_local._4_4_ = 0xe9;
        }
      }
      else {
        fptr_local._4_4_ = *(int *)colptr->ttype;
      }
    }
    else {
      *status = 0x142;
      fptr_local._4_4_ = 0x142;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpscl(fitsfile *fptr,      /* I - FITS file pointer               */
           double scale,        /* I - scaling factor: value of BSCALE */
           double zero,         /* I - zero point: value of BZERO      */
           int *status)         /* IO - error status                   */
/*
  Define the linear scaling factor for the primary array or image extension
  pixel values. This routine overrides the scaling values given by the
  BSCALE and BZERO keywords if present.  Note that this routine does not
  write or modify the BSCALE and BZERO keywords, but instead only modifies
  the values temporarily in the internal buffer.  Thus, a subsequent call to
  the ffrdef routine will reset the scaling back to the BSCALE and BZERO
  keyword values (or 1. and 0. respectively if the keywords are not present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (scale == 0)
        return(*status = ZERO_SCALE);  /* zero scale value is illegal */

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != IMAGE_HDU)
        return(*status = NOT_IMAGE);         /* not proper HDU type */

    if (fits_is_compressed_image(fptr, status)) /* compressed images */
    {
        (fptr->Fptr)->cn_bscale = scale;
        (fptr->Fptr)->cn_bzero  = zero;
        return(*status);
    }

    /* set pointer to the first 'column' (contains group parameters if any) */
    colptr = (fptr->Fptr)->tableptr; 

    colptr++;   /* increment to the 2nd 'column' pointer  (the image itself) */

    colptr->tscale = scale;
    colptr->tzero = zero;

    return(*status);
}